

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::reactive_socket_recv_op_base
          (reactive_socket_recv_op_base<asio::mutable_buffers_1> *this,socket_type socket,
          state_type state,mutable_buffers_1 *buffers,message_flags flags,func_type complete_func)

{
  size_t sVar1;
  
  reactor_op::reactor_op(&this->super_reactor_op,do_perform,complete_func);
  this->socket_ = socket;
  this->state_ = state;
  sVar1 = (buffers->super_mutable_buffer).size_;
  (this->buffers_).super_mutable_buffer.data_ = (buffers->super_mutable_buffer).data_;
  (this->buffers_).super_mutable_buffer.size_ = sVar1;
  this->flags_ = flags;
  return;
}

Assistant:

reactive_socket_recv_op_base(socket_type socket,
      socket_ops::state_type state, const MutableBufferSequence& buffers,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(&reactive_socket_recv_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      buffers_(buffers),
      flags_(flags)
  {
  }